

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBlockData.cpp
# Opt level: O0

void __thiscall GlobOptBlockData::SetValue(GlobOptBlockData *this,Value *val,Sym *sym)

{
  BVSparse<Memory::JitArenaAllocator> *this_00;
  bool bVar1;
  ValueNumber i;
  ValueInfo *valueInfo_00;
  Sym *this_01;
  StackSym *this_02;
  bool isStackSym;
  ValueInfo *valueInfo;
  Sym *sym_local;
  Value *val_local;
  GlobOptBlockData *this_local;
  
  valueInfo_00 = ::Value::GetValueInfo(val);
  this_01 = GlobOpt::SetSymStore(this->globOpt,valueInfo_00,sym);
  bVar1 = Sym::IsStackSym(this_01);
  if (bVar1) {
    this_02 = Sym::AsStackSym(this_01);
    bVar1 = StackSym::IsFromByteCodeConstantTable(this_02);
    if (bVar1) {
      SparseArray<Value>::Set(this->globOpt->byteCodeConstantValueArray,this_01->m_id,val);
      this_00 = this->globOpt->byteCodeConstantValueNumbersBv;
      i = ::Value::GetValueNumber(val);
      BVSparse<Memory::JitArenaAllocator>::Set(this_00,i);
      return;
    }
  }
  SetValueToHashTable(this,this->symToValueMap,val,this_01);
  SetChangedSym(this,this_01);
  return;
}

Assistant:

void
GlobOptBlockData::SetValue(Value *val, Sym * sym)
{
    ValueInfo *valueInfo = val->GetValueInfo();

    sym = this->globOpt->SetSymStore(valueInfo, sym);
    bool isStackSym = sym->IsStackSym();

    if (isStackSym && sym->AsStackSym()->IsFromByteCodeConstantTable())
    {
        // Put the constants in a global array. This will minimize the per-block info.
        this->globOpt->byteCodeConstantValueArray->Set(sym->m_id, val);
        this->globOpt->byteCodeConstantValueNumbersBv->Set(val->GetValueNumber());
    }
    else
    {
        this->SetValueToHashTable(this->symToValueMap, val, sym);
        this->SetChangedSym(sym);
    }
}